

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O1

void zmaxheap_test(void)

{
  int iVar1;
  void *__ptr;
  zmaxheap_t *heap;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  float outfv;
  int32_t outv;
  int32_t v;
  float local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  __ptr = calloc(4,10000);
  heap = (zmaxheap_t *)calloc(1,0x28);
  heap->el_sz = 4;
  heap->swap = swap_default;
  uVar7 = 0;
  uVar5 = 0;
  iVar6 = 0;
  uVar9 = 0;
  do {
    if (uVar7 != heap->size) {
      __assert_fail("sz == heap->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                    ,0x16c,"void zmaxheap_test()");
    }
    uVar2 = random();
    if (((int)uVar7 < 10000) && ((uVar2 & 1) == 0)) {
      lVar3 = random();
      local_3c = (int)(SUB168(SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                 (SUB164(SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
      *(int *)((long)__ptr + (long)(int)uVar7 * 4) = local_3c;
      zmaxheap_add(heap,&local_3c,(float)local_3c);
      uVar7 = uVar7 + 1;
    }
    else {
      if ((int)uVar7 < 1) {
        local_38 = -1;
        iVar8 = -1;
      }
      else {
        uVar2 = 0xffffffff;
        uVar4 = 0;
        iVar8 = -1;
        do {
          iVar1 = *(int *)((long)__ptr + uVar4 * 4);
          if (iVar8 < iVar1) {
            uVar2 = uVar4 & 0xffffffff;
            iVar8 = iVar1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
        local_38 = (long)(int)uVar2;
      }
      iVar1 = zmaxheap_remove_index(heap,0,&local_40,&local_44);
      if (uVar7 == 0) {
        uVar7 = 0;
        if (iVar1 != 0) {
          __assert_fail("res == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x189,"void zmaxheap_test()");
        }
      }
      else {
        if ((local_44 != (float)local_40) || (NAN(local_44) || NAN((float)local_40))) {
          __assert_fail("outv == outfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18c,"void zmaxheap_test()");
        }
        if (iVar8 != local_40) {
          __assert_fail("maxv == outv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18d,"void zmaxheap_test()");
        }
        *(undefined4 *)((long)__ptr + local_38 * 4) =
             *(undefined4 *)((long)__ptr + (long)(int)uVar7 * 4 + -4);
        uVar7 = uVar7 - 1;
      }
    }
    if ((int)uVar5 < (int)uVar7) {
      uVar5 = uVar7;
    }
    uVar9 = uVar9 + (uVar7 == 0 && 0 < (int)uVar5);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 5000000);
  printf("max size: %d, zcount %d\n",(ulong)uVar5,(ulong)uVar9);
  free(__ptr);
  return;
}

Assistant:

void zmaxheap_test()
{
    int cap = 10000;
    int sz = 0;
    int32_t *vals = calloc(sizeof(int32_t), cap);

    zmaxheap_t *heap = zmaxheap_create(sizeof(int32_t));

    int maxsz = 0;
    int zcnt = 0;

    for (int iter = 0; iter < 5000000; iter++) {
        assert(sz == heap->size);

        if ((random() & 1) == 0 && sz < cap) {
            // add a value
            int32_t v = (int32_t) (random() / 1000);
            float fv = v;
            assert(v == fv);

            vals[sz] = v;
            zmaxheap_add(heap, &v, fv);
            sz++;

//            printf("add %d %f\n", v, fv);
        } else {
            // remove a value
            int maxv = -1, maxi = -1;

            for (int i = 0; i < sz; i++) {
                if (vals[i] > maxv) {
                    maxv = vals[i];
                    maxi = i;
                }
            }


            int32_t outv;
            float outfv;
            int res = zmaxheap_remove_max(heap, &outv, &outfv);
            if (sz == 0) {
                assert(res == 0);
            } else {
//                printf("%d %d %d %f\n", sz, maxv, outv, outfv);
                assert(outv == outfv);
                assert(maxv == outv);

                // shuffle erase the maximum from our list.
                vals[maxi] = vals[sz - 1];
                sz--;
            }
        }

        if (sz > maxsz)
            maxsz = sz;

        if (maxsz > 0 && sz == 0)
            zcnt++;
    }

    printf("max size: %d, zcount %d\n", maxsz, zcnt);
    free (vals);
}